

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.h
# Opt level: O0

tuple<bool,_unsigned_long> __thiscall Sexp::Length(Sexp *this)

{
  bool bVar1;
  undefined8 extraout_RDX;
  Sexp *in_RSI;
  tuple<bool,_unsigned_long> tVar3;
  undefined1 local_3a;
  undefined1 local_39;
  long local_38;
  size_t count;
  Sexp *cursor;
  tuple<bool,_int> local_20 [2];
  Sexp *this_local;
  undefined8 uVar2;
  
  this_local = this;
  bVar1 = IsCons(in_RSI);
  if (bVar1) {
    local_38 = 0;
    count = (size_t)in_RSI;
    while( true ) {
      bVar1 = IsEmpty((Sexp *)count);
      if (bVar1) break;
      bVar1 = IsCons((Sexp *)count);
      if (!bVar1) {
        local_39 = 0;
        tVar3 = std::make_tuple<bool,unsigned_long&>((bool *)this,(unsigned_long *)&local_39);
        uVar2 = tVar3.super__Tuple_impl<0UL,_bool,_unsigned_long>._8_8_;
        goto LAB_00135b1b;
      }
      local_38 = local_38 + 1;
      count = *(size_t *)(count + 0x10);
    }
    local_3a = 1;
    tVar3 = std::make_tuple<bool,unsigned_long&>((bool *)this,(unsigned_long *)&local_3a);
    uVar2 = tVar3.super__Tuple_impl<0UL,_bool,_unsigned_long>._8_8_;
  }
  else {
    cursor._7_1_ = 0;
    cursor._0_4_ = 0;
    std::make_tuple<bool,int>((bool *)local_20,(int *)((long)&cursor + 7));
    std::tuple<bool,_unsigned_long>::tuple<bool,_int,_true>
              ((tuple<bool,_unsigned_long> *)this,local_20);
    uVar2 = extraout_RDX;
  }
LAB_00135b1b:
  tVar3.super__Tuple_impl<0UL,_bool,_unsigned_long>._8_8_ = uVar2;
  tVar3.super__Tuple_impl<0UL,_bool,_unsigned_long>.super__Tuple_impl<1UL,_unsigned_long>.
  super__Head_base<1UL,_unsigned_long,_false>._M_head_impl =
       (_Head_base<1UL,_unsigned_long,_false>)(_Head_base<1UL,_unsigned_long,_false>)this;
  return (tuple<bool,_unsigned_long>)tVar3.super__Tuple_impl<0UL,_bool,_unsigned_long>;
}

Assistant:

inline std::tuple<bool, size_t> Length() const {
    if (!IsCons()) {
      // if it's not a list, it has length 0.
      return std::make_tuple(false, 0);
    }

    const Sexp *cursor = this;
    size_t count = 0;
    while (true) {
      if (cursor->IsEmpty()) {
        break;
      }

      if (!cursor->IsCons()) {
        return std::make_tuple(false, count);
      }

      count++;
      cursor = cursor->cons.cdr;
    }

    return std::make_tuple(true, count);
  }